

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cc
# Opt level: O3

Info * __thiscall wabt::Opcode::GetInfo(Opcode *this)

{
  Enum EVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined1 uVar9;
  undefined3 uVar10;
  uint uVar11;
  long lVar12;
  Info *in_RDI;
  
  EVar1 = this->enum_;
  if ((ulong)EVar1 < 0x1c6) {
    lVar12 = (ulong)EVar1 * 0x30;
    pcVar2 = *(char **)(infos_ + lVar12);
    pcVar3 = *(char **)(infos_ + lVar12 + 8);
    uVar4 = *(undefined8 *)(infos_ + lVar12 + 0x10);
    uVar5 = *(undefined8 *)(infos_ + lVar12 + 0x18);
    uVar6 = *(undefined8 *)(infos_ + lVar12 + 0x20);
    uVar7 = *(undefined8 *)(infos_ + lVar12 + 0x28);
    in_RDI->memory_size = (int)uVar6;
    in_RDI->prefix = (char)((ulong)uVar6 >> 0x20);
    *(int3 *)&in_RDI->field_0x25 = (int3)((ulong)uVar6 >> 0x28);
    in_RDI->code = (int)uVar7;
    in_RDI->prefix_code = (int)((ulong)uVar7 >> 0x20);
    in_RDI->result_type = (Type)(int)uVar4;
    in_RDI->param_types[0] = (Type)(int)((ulong)uVar4 >> 0x20);
    *(undefined8 *)(in_RDI->param_types + 1) = uVar5;
    in_RDI->name = pcVar2;
    in_RDI->decomp = pcVar3;
    return in_RDI;
  }
  uVar9 = infos_[0x5544];
  uVar10 = infos_._21829_3_;
  in_RDI->memory_size = infos_._21824_4_;
  uVar4 = infos_._21816_8_;
  in_RDI->prefix = uVar9;
  *(undefined3 *)&in_RDI->field_0x25 = uVar10;
  uVar8 = infos_._21812_4_;
  in_RDI->result_type = (Type)infos_._21808_4_;
  in_RDI->param_types[0] = (Type)uVar8;
  *(undefined8 *)(in_RDI->param_types + 1) = uVar4;
  uVar4 = infos_._21800_8_;
  in_RDI->name = (char *)infos_._21792_8_;
  in_RDI->decomp = (char *)uVar4;
  uVar11 = -EVar1;
  in_RDI->prefix = (uint8_t)(uVar11 >> 8);
  in_RDI->code = uVar11 & 0xff;
  in_RDI->prefix_code = uVar11 & 0xffff;
  return in_RDI;
}

Assistant:

Opcode::Info Opcode::GetInfo() const {
  if (enum_ < Invalid) {
    return infos_[enum_];
  }

  Info invalid_info = infos_[Opcode::Invalid];
  DecodeInvalidOpcode(enum_, &invalid_info.prefix, &invalid_info.code);
  invalid_info.prefix_code = PrefixCode(invalid_info.prefix, invalid_info.code);
  return invalid_info;
}